

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O0

side_type helix::nasdaq::itch_side(char c)

{
  invalid_argument *this;
  char in_DIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  allocator local_49;
  string local_48 [4];
  int in_stack_ffffffffffffffbc;
  string local_28 [39];
  side_type local_1;
  
  if (in_DIL == 'B') {
    local_1 = buy;
  }
  else {
    if (in_DIL != 'S') {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"invalid argument: ",&local_49);
      std::__cxx11::to_string(in_stack_ffffffffffffffbc);
      std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      std::invalid_argument::invalid_argument(this,local_28);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_1 = sell;
  }
  return local_1;
}

Assistant:

static side_type itch_side(char c)
{
    switch (c) {
    case 'B': return side_type::buy;
    case 'S': return side_type::sell;
    default:  throw invalid_argument(string("invalid argument: ") + to_string(c));
    }
}